

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_universal_argument(EditLine *el,wint_t c)

{
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_state).argument < L'\x000f4241') {
    (el->el_state).doingarg = L'\x01';
    (el->el_state).argument = (el->el_state).argument << 2;
    el_local._7_1_ = '\x03';
  }
  else {
    el_local._7_1_ = '\x06';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_universal_argument(EditLine *el, wint_t c __attribute__((__unused__)))
{				/* multiply current argument by 4 */

	if (el->el_state.argument > 1000000)
		return CC_ERROR;
	el->el_state.doingarg = 1;
	el->el_state.argument *= 4;
	return CC_ARGHACK;
}